

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_math.c
# Opt level: O3

int jpc_int_firstone(int x)

{
  uint uVar1;
  
  if (-1 < x) {
    uVar1 = 0x1f;
    if (x != 0) {
      for (; (uint)x >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    return -(uint)(x == 0) | uVar1;
  }
  __assert_fail("x >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_math.c"
                ,0x6c,"int jpc_int_firstone(int)");
}

Assistant:

int jpc_int_firstone(int x)
{
	int n;

	/* The argument must be nonnegative. */
	assert(x >= 0);

	n = -1;
	while (x > 0) {
		x >>= 1;
		++n;
	}
	return n;
}